

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_>::Initialize
          (TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_> *this)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  TPZDohrAssembly<float> *pTVar4;
  TPZVec<int> *pTVar5;
  int *piVar6;
  void *pvVar7;
  reference this_00;
  TPZManVector<long,_10> *this_01;
  long in_RDI;
  int count;
  iterator it;
  TPZMatrix<float> *coarse;
  int64_t eq_1;
  int64_t eq;
  int64_t mineq;
  int64_t ic_1;
  int64_t nc;
  int64_t isub;
  int64_t nsub;
  int64_t ic;
  TPZManVector<long,_10> skyline;
  list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
  *in_stack_fffffffffffffe18;
  TPZDohrAssembly<float> *in_stack_fffffffffffffe38;
  TPZDohrSubstructCondense<float> *in_stack_fffffffffffffe40;
  TPZVec<long> *in_stack_fffffffffffffe50;
  TPZMatrix<float> *in_stack_fffffffffffffe58;
  TPZDohrSubstructCondense<float> *in_stack_fffffffffffffe60;
  TPZVec<long> *local_180;
  _Self local_f0;
  _List_node_base *local_e8;
  int local_dc;
  _List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> local_d8;
  void *local_d0;
  int64_t local_c8;
  TPZVec<long> *local_c0;
  TPZVec<long> *local_b8;
  long local_b0;
  int64_t local_a8;
  long local_a0;
  long local_98;
  long local_80;
  TPZVec<long> local_78 [3];
  
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe38)
  ;
  for (local_80 = 0; lVar1 = local_80, local_80 < *(long *)(in_RDI + 0x40); local_80 = local_80 + 1)
  {
    plVar3 = TPZVec<long>::operator[](local_78,local_80);
    *plVar3 = lVar1;
  }
  pTVar4 = TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                     ((TPZAutoPointer<TPZDohrAssembly<float>_> *)(in_RDI + 0x50));
  local_98 = TPZVec<TPZVec<int>_>::NElements(&pTVar4->fCoarseEqs);
  for (local_a0 = 0; local_a0 < local_98; local_a0 = local_a0 + 1) {
    pTVar4 = TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                       ((TPZAutoPointer<TPZDohrAssembly<float>_> *)(in_RDI + 0x50));
    pTVar5 = TPZVec<TPZVec<int>_>::operator[](&pTVar4->fCoarseEqs,local_a0);
    local_a8 = TPZVec<int>::NElements(pTVar5);
    local_b8 = (TPZVec<long> *)0x0;
    if (local_a8 != 0) {
      pTVar4 = TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                         ((TPZAutoPointer<TPZDohrAssembly<float>_> *)(in_RDI + 0x50));
      pTVar5 = TPZVec<TPZVec<int>_>::operator[](&pTVar4->fCoarseEqs,local_a0);
      piVar6 = TPZVec<int>::operator[](pTVar5,0);
      local_b8 = (TPZVec<long> *)(long)*piVar6;
    }
    for (local_b0 = 0; local_b0 < local_a8; local_b0 = local_b0 + 1) {
      pTVar4 = TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                         ((TPZAutoPointer<TPZDohrAssembly<float>_> *)(in_RDI + 0x50));
      pTVar5 = TPZVec<TPZVec<int>_>::operator[](&pTVar4->fCoarseEqs,local_a0);
      piVar6 = TPZVec<int>::operator[](pTVar5,local_b0);
      local_c0 = (TPZVec<long> *)(long)*piVar6;
      local_180 = local_c0;
      if ((long)local_b8 <= (long)local_c0) {
        local_180 = local_b8;
      }
      local_b8 = local_180;
    }
    for (local_b0 = 0; local_b0 < local_a8; local_b0 = local_b0 + 1) {
      pTVar4 = TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                         ((TPZAutoPointer<TPZDohrAssembly<float>_> *)(in_RDI + 0x50));
      pTVar5 = TPZVec<TPZVec<int>_>::operator[](&pTVar4->fCoarseEqs,local_a0);
      piVar6 = TPZVec<int>::operator[](pTVar5,local_b0);
      local_c8 = (int64_t)*piVar6;
      in_stack_fffffffffffffe60 =
           (TPZDohrSubstructCondense<float> *)TPZVec<long>::operator[](local_78,local_c8);
      if ((long)local_b8 <
          (long)(((TPZMatrix<float> *)&in_stack_fffffffffffffe60->super_TPZSavable)->
                super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable) {
        in_stack_fffffffffffffe50 = local_b8;
        in_stack_fffffffffffffe58 = (TPZMatrix<float> *)TPZVec<long>::operator[](local_78,local_c8);
        (in_stack_fffffffffffffe58->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable =
             (_func_int **)in_stack_fffffffffffffe50;
      }
    }
  }
  pvVar7 = operator_new(0x60);
  TPZSkylMatrix<float>::TPZSkylMatrix
            ((TPZSkylMatrix<float> *)in_stack_fffffffffffffe60,(int64_t)in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50);
  local_d0 = pvVar7;
  std::_List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::_List_iterator(&local_d8);
  local_dc = 0;
  local_e8 = (_List_node_base *)
             std::__cxx11::
             list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
             ::begin(in_stack_fffffffffffffe18);
  local_d8._M_node = local_e8;
  while( true ) {
    local_f0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
         ::end(in_stack_fffffffffffffe18);
    bVar2 = std::operator!=(&local_d8,&local_f0);
    if (!bVar2) break;
    this_00 = std::_List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::operator*
                        ((_List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> *)
                         0x1f7cc62);
    in_stack_fffffffffffffe40 =
         TPZAutoPointer<TPZDohrSubstructCondense<float>_>::operator->(this_00);
    in_stack_fffffffffffffe38 =
         TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<float>_> *)(in_RDI + 0x50));
    TPZVec<TPZVec<int>_>::operator[](&in_stack_fffffffffffffe38->fCoarseEqs,(long)local_dc);
    TPZDohrSubstructCondense<float>::Contribute_Kc
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (TPZVec<int> *)in_stack_fffffffffffffe50);
    std::_List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::operator++(&local_d8,0);
    local_dc = local_dc + 1;
  }
  this_01 = (TPZManVector<long,_10> *)operator_new(0x100);
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<float>_> *)in_stack_fffffffffffffe40,
             (TPZMatrix<float> *)in_stack_fffffffffffffe38);
  TPZStepSolver<float>::TPZStepSolver
            ((TPZStepSolver<float> *)in_stack_fffffffffffffe60,
             (TPZAutoPointer<TPZMatrix<float>_> *)in_stack_fffffffffffffe58);
  *(TPZManVector<long,_10> **)(in_RDI + 0x38) = this_01;
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer((TPZAutoPointer<TPZMatrix<float>_> *)this_01);
  TPZManVector<long,_10>::~TPZManVector(this_01);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::Initialize()
{
	//Compute the skyline of the coarse equations
	TPZManVector<int64_t> skyline(fNumCoarse);
	int64_t ic;
	for (ic=0; ic<fNumCoarse; ic++) {
		skyline[ic] = ic;
	}
	int64_t nsub = fAssemble->fCoarseEqs.NElements();
	int64_t isub;
	for (isub=0; isub<nsub; isub++) {
		int64_t nc = fAssemble->fCoarseEqs[isub].NElements();
		int64_t ic;
		int64_t mineq = 0;
        if(nc != 0) mineq = fAssemble->fCoarseEqs[isub][0];
		for (ic=0; ic<nc; ic++) {
			int64_t eq = fAssemble->fCoarseEqs[isub][ic];
			mineq = mineq > eq ? eq : mineq;
		}
		for (ic=0; ic<nc; ic++) {
			int64_t eq = fAssemble->fCoarseEqs[isub][ic];
			if(skyline[eq] > mineq) skyline[eq] = mineq;
		}
	}
	/* Computing K(c) */
	TPZMatrix<TVar> *coarse = new TPZSkylMatrix<TVar>(fNumCoarse,skyline);
#ifdef PZDEBUG
	{
		TPZFMatrix<TVar> coarse2(*coarse);
		for (isub=0; isub<nsub; isub++) {
			int64_t nc = fAssemble->fCoarseEqs[isub].NElements();
			int64_t ic;
			for (ic=0; ic<nc; ic++) {
				int64_t ieq = fAssemble->fCoarseEqs[isub][ic];
				int64_t jc;
				for (jc=0; jc<nc; jc++) {
					int64_t jeq = fAssemble->fCoarseEqs[isub][jc];
					coarse2(ieq,jeq) = 1.;
				}
			}
			
		}
		VisualMatrix(coarse2,"CoarseMatrix.vtk");
	}
#endif
	typename std::list<TPZAutoPointer<TSubStruct> >::iterator it;
	int count = 0;
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,count++)
	{
		(*it)->Contribute_Kc(*coarse,fAssemble->fCoarseEqs[count]);
	}
	fCoarse = new TPZStepSolver<TVar>(coarse);
}